

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall Catch::Runner::runTests(Totals *__return_storage_ptr__,Runner *this)

{
  pointer *ppTVar1;
  pointer *ppPVar2;
  size_t sVar3;
  pointer pTVar4;
  int iVar5;
  undefined4 extraout_var;
  TestSpecParser *this_00;
  IRegistryHub *pIVar6;
  undefined4 extraout_var_00;
  iterator iVar7;
  undefined4 extraout_var_01;
  undefined1 auVar8 [8];
  undefined1 local_390 [8];
  RunContext context;
  undefined1 local_110 [32];
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  local_d8;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> vStack_c0;
  TagAliasRegistry *local_a8;
  Ptr<Catch::IStreamingReporter> *local_a0;
  undefined1 auStack_98 [8];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> skippedTestCases;
  undefined1 auStack_78 [8];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> testCases;
  undefined1 auStack_50 [8];
  TestSpec testSpec;
  
  local_110._0_8_ = (this->m_config).m_p;
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
  if ((Config *)local_110._0_8_ != (Config *)0x0) {
    (*(((Config *)local_110._0_8_)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  local_a0 = &this->m_reporter;
  RunContext::RunContext((RunContext *)local_390,(Ptr<const_Catch::IConfig> *)local_110,local_a0);
  if ((Config *)local_110._0_8_ != (Config *)0x0) {
    (**(code **)((long)*(IShared *)local_110._0_8_ + 0x18))();
  }
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[1].m_patterns.
  super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[1].m_patterns.
  super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage)->m_patterns).
  super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[1].m_patterns.
  super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage)->m_patterns).
  super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage)->m_patterns).
  super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110._0_8_ = (IConfig *)(local_110 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"all tests","");
  RunContext::testGroupStarting((RunContext *)local_390,(string *)local_110,1,1);
  if ((IConfig *)local_110._0_8_ != (IConfig *)(local_110 + 0x10)) {
    operator_delete((void *)local_110._0_8_);
  }
  iVar5 = (*(((this->m_config).m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)auStack_50
             ,(vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
              CONCAT44(extraout_var,iVar5));
  if (auStack_50 ==
      (undefined1  [8])
      testSpec.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start) {
    TagAliasRegistry::get();
    local_f0 = 0;
    local_e8._M_local_buf[0] = '\0';
    local_d8.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_c0.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_c0.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_c0.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8 = &TagAliasRegistry::get::instance;
    ppTVar1 = &testCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    local_110._24_8_ = &local_e8;
    auStack_78 = (undefined1  [8])ppTVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_78,"~[.]","");
    this_00 = TestSpecParser::parse((TestSpecParser *)local_110,(string *)auStack_78);
    TestSpecParser::addFilter(this_00);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &context.m_unfinishedSections.
                super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&(this_00->m_testSpec).m_filters)
    ;
    auStack_98 = auStack_50;
    auStack_50 = (undefined1  [8])
                 context.m_unfinishedSections.
                 super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    skippedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)testSpec.m_filters.
                  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    skippedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)testSpec.m_filters.
                  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    context.m_unfinishedSections.
    super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               auStack_98);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &context.m_unfinishedSections.
                super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (auStack_78 != (undefined1  [8])ppTVar1) {
      operator_delete((void *)auStack_78);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&vStack_c0);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._24_8_ != &local_e8) {
      operator_delete((void *)local_110._24_8_);
    }
  }
  auStack_78 = (undefined1  [8])0x0;
  testCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  testCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar6 = getRegistryHub();
  iVar5 = (*pIVar6->_vptr_IRegistryHub[3])(pIVar6);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x18))
            ((long *)CONCAT44(extraout_var_00,iVar5),auStack_50,(this->m_config).m_p,auStack_78,0);
  pTVar4 = testCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
           super__Vector_impl_data._M_start;
  skippedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if (auStack_78 !=
      (undefined1  [8])
      testCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start) {
    auVar8 = auStack_78;
    do {
      iVar7 = std::
              _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
              ::find(&(this->m_testsAlreadyRun)._M_t,(key_type *)auVar8);
      sVar3 = context.m_totals.assertions.passed;
      if ((_Rb_tree_header *)iVar7._M_node ==
          &(this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header) {
        iVar5 = (**(code **)(*(long *)context.m_lastResult.m_resultData._64_8_ + 0x50))();
        if (sVar3 == (long)iVar5) break;
        RunContext::runTest((Totals *)local_110,(RunContext *)local_390,(TestCase *)auVar8);
        ((testSpec.m_filters.
          super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
        super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(local_110._0_8_ +
                      (long)((testSpec.m_filters.
                              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
                            super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        ppPVar2 = &((testSpec.m_filters.
                     super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
                   super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppPVar2 = (pointer)((long)&(*ppPVar2)->m_p + local_110._8_8_);
        ppPVar2 = &((testSpec.m_filters.
                     super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_patterns).
                   super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *ppPVar2 = (pointer)((long)&(*ppPVar2)->m_p + local_110._16_8_);
        testSpec.m_filters.
        super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[1].m_patterns.
        super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)&(testSpec.m_filters.
                               super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage[1].m_patterns.
                               super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_p + local_110._24_8_);
        ppPVar2 = &testSpec.m_filters.
                   super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[1].m_patterns.
                   super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppPVar2 = (pointer)((long)&(*ppPVar2)->m_p + local_f0);
        ppPVar2 = &testSpec.m_filters.
                   super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[1].m_patterns.
                   super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *ppPVar2 = (pointer)((long)&(*ppPVar2)->m_p +
                            CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]))
        ;
        std::
        _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
        ::_M_insert_unique<Catch::TestCase_const&>
                  ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                    *)&this->m_testsAlreadyRun,(TestCase *)auVar8);
      }
      auVar8 = (undefined1  [8])((long)auVar8 + 0x118);
    } while (auVar8 != (undefined1  [8])pTVar4);
  }
  auStack_98 = (undefined1  [8])0x0;
  skippedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  skippedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar6 = getRegistryHub();
  iVar5 = (*pIVar6->_vptr_IRegistryHub[3])(pIVar6);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x18))
            ((long *)CONCAT44(extraout_var_01,iVar5),auStack_50,
             ((skippedTestCases.
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage)->super_TestCaseInfo).name._M_dataplus._M_p
             ,auStack_98,1);
  pTVar4 = skippedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (auVar8 = auStack_98; auVar8 != (undefined1  [8])pTVar4;
      auVar8 = (undefined1  [8])((long)auVar8 + 0x118)) {
    (*(local_a0->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
              (local_a0->m_p,auVar8);
  }
  local_110._0_8_ = (IConfig *)(local_110 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"all tests","");
  RunContext::testGroupEnded
            ((RunContext *)local_390,(string *)local_110,
             (Totals *)
             testSpec.m_filters.
             super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,1,1);
  if ((IConfig *)local_110._0_8_ != (IConfig *)(local_110 + 0x10)) {
    operator_delete((void *)local_110._0_8_);
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)auStack_98);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)auStack_78);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)auStack_50
            );
  RunContext::~RunContext((RunContext *)local_390);
  return (Totals *)
         testSpec.m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
}

Assistant:

Totals runTests() {

            RunContext context( m_config.get(), m_reporter );

            Totals totals;

            context.testGroupStarting( "all tests", 1, 1 ); // deprecated?

            TestSpec testSpec = m_config->testSpec();
            if( !testSpec.hasFilters() )
                testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

            std::vector<TestCase> testCases;
            getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, *m_config, testCases );

            int testsRunForGroup = 0;
            for( std::vector<TestCase>::const_iterator it = testCases.begin(), itEnd = testCases.end();
                    it != itEnd;
                    ++it ) {
                testsRunForGroup++;
                if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                    if( context.aborting() )
                        break;

                    totals += context.runTest( *it );
                    m_testsAlreadyRun.insert( *it );
                }
            }
            std::vector<TestCase> skippedTestCases;
            getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, *m_config, skippedTestCases, true );

            for( std::vector<TestCase>::const_iterator it = skippedTestCases.begin(), itEnd = skippedTestCases.end();
                    it != itEnd;
                    ++it )
                m_reporter->skipTest( *it );

            context.testGroupEnded( "all tests", totals, 1, 1 );
            return totals;
        }